

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsprg.cpp
# Opt level: O3

CTPNStmTop * __thiscall CTcParser::parse_template_def(CTcParser *this,int *err,CTcToken *class_tok)

{
  CTcObjTemplateItem **ppCVar1;
  uint uVar2;
  byte *pbVar3;
  size_t sVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  byte bVar8;
  int iVar9;
  tc_toktyp_t tVar10;
  wchar_t wVar11;
  tc_toktyp_t tVar12;
  CTcObjTemplateItem *item;
  CVmHashEntry *this_00;
  char *pcVar13;
  CTcToken *pCVar14;
  CTcSymProp *pCVar15;
  CTcObjTemplateItem *pCVar16;
  CTcObjTemplateItem *pCVar17;
  ulong uVar18;
  byte bVar19;
  CTcObjTemplateItem *pCVar20;
  CTcObjTemplateItem *pCVar21;
  byte *pbVar22;
  bool bVar23;
  textchar_t *sym;
  CTcObjTemplateItem *pCVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  CTcToken prop_tok;
  tc_toktyp_t kwtok;
  CTcObjTemplateItem *local_88;
  size_t local_70;
  CTcToken local_68;
  tc_toktyp_t local_34;
  
  if (class_tok != (CTcToken *)0x0) {
    iVar9 = CTcToken::text_matches(class_tok,"string");
    if (iVar9 != 0) {
      parse_string_template_def(this,err);
      return (CTPNStmTop *)0x0;
    }
    sym = class_tok->text_;
    this_00 = (CVmHashEntry *)
              CTcPrsSymtab::find_noref
                        (this->global_symtab_,sym,class_tok->text_len_,(CTcPrsSymtab **)0x0);
    if (this_00 == (CVmHashEntry *)0x0) {
      this_00 = (CVmHashEntry *)CTcSymbolBase::operator_new((CTcSymbolBase *)0xc0,(size_t)sym);
      pcVar13 = class_tok->text_;
      sVar4 = class_tok->text_len_;
      uVar2 = G_cg->next_obj_;
      G_cg->next_obj_ = uVar2 + 1;
      CVmHashEntry::CVmHashEntry(this_00,pcVar13,sVar4,0);
      *(undefined4 *)&this_00->field_0x24 = 2;
      this_00[1]._vptr_CVmHashEntry = (_func_int **)(ulong)uVar2;
      sVar4 = this_00[4].len_;
      this_00[1].nxt_ = (CVmHashEntry *)0xffffffff;
      this_00[4].str_ = (char *)0x0;
      *(undefined8 *)&this_00[3].field_0x20 = 0;
      this_00[4]._vptr_CVmHashEntry = (_func_int **)0x0;
      *(undefined4 *)&this_00[4].nxt_ = 0;
      this_00[1].str_ = (char *)0x0;
      this_00[1].len_ = 0;
      *(undefined8 *)&this_00[1].field_0x20 = 0;
      this_00[2]._vptr_CVmHashEntry = (_func_int **)0x0;
      this_00[2].nxt_ = (CVmHashEntry *)0x0;
      this_00[2].str_ = (char *)0x0;
      this_00[2].len_ = 0;
      *(undefined8 *)&this_00[2].field_0x20 = 0;
      this_00[3]._vptr_CVmHashEntry = (_func_int **)0x0;
      this_00[3].nxt_ = (CVmHashEntry *)0x0;
      *(undefined8 *)((long)&this_00[3].nxt_ + 4) = 0;
      *(undefined8 *)((long)&this_00[3].str_ + 4) = 0;
      *(ushort *)&this_00[4].len_ = ((ushort)(int)sVar4 & 0xf000) + 1;
      this_00->_vptr_CVmHashEntry = (_func_int **)&PTR__CVmHashEntry_003187b0;
      (*this->global_symtab_->_vptr_CTcPrsSymtab[3])(this->global_symtab_,this_00);
      goto LAB_001dc60b;
    }
    if ((*(int *)&this_00->field_0x24 == 2) && ((int)this_00[3].len_ == 0)) goto LAB_001dc60b;
    CTcTokenizer::log_error_curtok(G_tok,0x2b60);
  }
  this_00 = (CVmHashEntry *)0x0;
LAB_001dc60b:
  CTcTokenizer::next(G_tok);
  bVar6 = true;
  pCVar24 = (CTcObjTemplateItem *)0x0;
  local_88 = (CTcObjTemplateItem *)0x0;
  bVar7 = false;
  local_70 = 0;
  pCVar17 = (CTcObjTemplateItem *)0x0;
  do {
    tVar12 = (G_tok->curtok_).typ_;
    if (0x3f < (int)tVar12) {
      if ((int)tVar12 < 0x4f) {
        if ((tVar12 - TOKT_NOT < 2) || (tVar12 == TOKT_AT)) goto switchD_001dc67a_caseD_15;
      }
      else {
        if (tVar12 == TOKT_INHERITED) {
          bVar26 = false;
          bVar25 = true;
          bVar7 = true;
          goto LAB_001dc91e;
        }
        if (tVar12 == TOKT_OBJECT) goto switchD_001dc67a_caseD_17;
      }
      goto switchD_001dc67a_caseD_b;
    }
    switch(tVar12) {
    case TOKT_SSTR:
    case TOKT_DSTR:
      pCVar14 = CTcTokenizer::copycur(G_tok);
      local_68._32_1_ = pCVar14->field_0x20;
      local_68.typ_ = pCVar14->typ_;
      local_68._4_4_ = *(undefined4 *)&pCVar14->field_0x4;
      local_68.text_ = pCVar14->text_;
      local_68.text_len_ = pCVar14->text_len_;
      local_68.int_val_ = pCVar14->int_val_;
      tVar12 = (G_tok->curtok_).typ_;
      sVar4 = (G_tok->curtok_).text_len_;
      if (sVar4 != 0) {
        pbVar3 = (byte *)(G_tok->curtok_).text_;
        wVar11 = utf8_ptr::s_getch((char *)pbVar3);
        if ((uint)wVar11 < 0x80) {
          bVar26 = true;
          if (wVar11 != L'_') {
            iVar9 = isalpha(wVar11);
            bVar26 = iVar9 != 0;
          }
        }
        else {
          bVar26 = false;
        }
        pbVar22 = pbVar3 + (sVar4 - (long)(pbVar3 + (ulong)(((*pbVar3 >> 5 & 1) != 0) + 1 &
                                                           (uint)(*pbVar3 >> 7) * 3) + 1));
        pbVar3 = pbVar3 + (ulong)(((*pbVar3 >> 5 & 1) != 0) + 1 & (uint)(*pbVar3 >> 7) * 3) + 1;
        while ((pbVar22 != (byte *)0x0 && (bVar26))) {
          wVar11 = utf8_ptr::s_getch((char *)pbVar3);
          if ((0x7f < (uint)wVar11) ||
             ((bVar26 = true, wVar11 != L'_' &&
              (iVar9 = isalpha(wVar11), (uint)(wVar11 + L'\xffffffc6') < 0xfffffff6 && iVar9 == 0)))
             ) {
            bVar26 = false;
          }
          pbVar22 = pbVar3 + ((long)pbVar22 -
                             (long)(pbVar3 + (ulong)(((*pbVar3 >> 5 & 1) != 0) + 1 &
                                                    (uint)(*pbVar3 >> 7) * 3) + 1));
          pbVar3 = pbVar3 + (ulong)(((*pbVar3 >> 5 & 1) != 0) + 1 & (uint)(*pbVar3 >> 7) * 3) + 1;
        }
        if ((bVar26) &&
           (iVar9 = CTcTokenizer::look_up_keyword(G_tok,&G_tok->curtok_,&local_34), iVar9 == 0)) {
          bVar25 = true;
          goto LAB_001dc91c;
        }
      }
      CTcTokenizer::log_error_curtok(G_tok,0x2b96);
      goto LAB_001dc919;
    case TOKT_COMMA:
    case TOKT_PLUS:
    case TOKT_MINUS:
    case TOKT_TIMES:
    case TOKT_DIV:
    case TOKT_MOD:
    case TOKT_ARROW:
    case TOKT_AND:
switchD_001dc67a_caseD_15:
      tVar10 = CTcTokenizer::next(G_tok);
      bVar25 = tVar10 == TOKT_SYM;
      if (!bVar25) {
        pcVar13 = CTcTokenizer::get_op_text(tVar12);
        CTcTokenizer::log_error(0x2b95,pcVar13,(ulong)(uint)(G_tok->curtok_).text_len_);
      }
      pCVar14 = CTcTokenizer::copycur(G_tok);
      local_68.typ_ = pCVar14->typ_;
      local_68._4_4_ = *(undefined4 *)&pCVar14->field_0x4;
      local_68.text_ = pCVar14->text_;
      local_68.text_len_ = pCVar14->text_len_;
      local_68.int_val_ = pCVar14->int_val_;
      local_68._32_1_ = pCVar14->field_0x20;
      goto LAB_001dc91c;
    case TOKT_LBRACE:
    case TOKT_RBRACE:
switchD_001dc67a_caseD_17:
      CTcTokenizer::log_error_curtok(G_tok,0x2b98);
      bVar25 = false;
      goto LAB_001dc814;
    case TOKT_LBRACK:
      tVar12 = CTcTokenizer::next(G_tok);
      if (tVar12 == TOKT_SYM) {
        pCVar14 = CTcTokenizer::copycur(G_tok);
        local_68.typ_ = pCVar14->typ_;
        local_68._4_4_ = *(undefined4 *)&pCVar14->field_0x4;
        local_68.text_ = pCVar14->text_;
        local_68.text_len_ = pCVar14->text_len_;
        local_68.int_val_ = pCVar14->int_val_;
        local_68._32_1_ = pCVar14->field_0x20;
        tVar10 = CTcTokenizer::next(G_tok);
        tVar12 = TOKT_LBRACK;
        bVar26 = true;
        if (tVar10 != TOKT_RBRACK) {
          CTcTokenizer::log_error_curtok(G_tok,0x2b97);
        }
        bVar25 = true;
      }
      else {
        tVar12 = TOKT_LBRACK;
        pcVar13 = CTcTokenizer::get_op_text(TOKT_LBRACK);
        bVar25 = false;
        CTcTokenizer::log_error(0x2b95,pcVar13,(ulong)(uint)(G_tok->curtok_).text_len_);
        uVar18 = (ulong)(G_tok->curtok_).typ_;
        if ((uVar18 < 0x2b) && ((0x40005800004U >> (uVar18 & 0x3f) & 1) != 0)) goto LAB_001dc91c;
        bVar26 = true;
        CTcTokenizer::next(G_tok);
      }
      goto LAB_001dc91e;
    case TOKT_SEM:
      CTcTokenizer::next(G_tok);
      tVar12 = TOKT_SEM;
      bVar25 = true;
LAB_001dc814:
      bVar23 = false;
      bVar26 = true;
      bVar5 = true;
      bVar19 = 0;
      bVar27 = false;
      break;
    default:
      if (tVar12 == TOKT_EOF) goto switchD_001dc67a_caseD_17;
    case TOKT_SSTR_START:
    case TOKT_SSTR_MID:
    case TOKT_SSTR_END:
    case TOKT_DSTR_START:
    case TOKT_DSTR_MID:
    case TOKT_DSTR_END:
    case TOKT_RESTR:
    case TOKT_LPAR:
    case TOKT_RPAR:
    case TOKT_DOT:
    case TOKT_RBRACK:
    case TOKT_EQ:
    case TOKT_EQEQ:
    case TOKT_ASI:
    case TOKT_GT:
    case TOKT_LT:
    case TOKT_GE:
    case TOKT_LE:
    case TOKT_NE:
    case TOKT_COLON:
switchD_001dc67a_caseD_b:
      CTcTokenizer::log_error_curtok(G_tok,0x2b98);
      CTcTokenizer::next(G_tok);
LAB_001dc919:
      bVar25 = false;
LAB_001dc91c:
      bVar26 = true;
LAB_001dc91e:
      CTcTokenizer::next(G_tok);
      tVar10 = (G_tok->curtok_).typ_;
      bVar27 = tVar10 == TOKT_QUESTION;
      if (bVar27) {
        CTcTokenizer::next(G_tok);
        tVar10 = (G_tok->curtok_).typ_;
      }
      if (tVar10 == TOKT_OR) {
        CTcTokenizer::next(G_tok);
        bVar23 = true;
        bVar5 = false;
        bVar19 = 1;
      }
      else {
        bVar23 = true;
        bVar19 = 0;
        bVar5 = true;
      }
    }
    if ((pCVar17 != (CTcObjTemplateItem *)0x0) && (bVar8 = pCVar17->field_0x18, (bVar8 & 1) != 0)) {
      if ((bVar27) && (pCVar16 = pCVar24, pCVar24 != (CTcObjTemplateItem *)0x0)) {
        do {
          pCVar16->field_0x18 = pCVar16->field_0x18 | 2;
          ppCVar1 = &pCVar16->nxt_;
          pCVar16 = *ppCVar1;
        } while (*ppCVar1 != (CTcObjTemplateItem *)0x0);
        bVar8 = pCVar17->field_0x18;
      }
      if ((bVar8 & 2) != 0) {
        bVar27 = true;
      }
    }
    if (!bVar25) {
      bVar6 = false;
    }
    if ((bool)(bVar25 & bVar23)) {
      if (bVar26) {
        pCVar15 = look_up_prop(this,&local_68,0);
        if (pCVar15 == (CTcSymProp *)0x0) {
          iVar9 = 0x2b99;
          pcVar13 = local_68.text_;
          uVar2 = (uint)local_68.text_len_;
        }
        else {
          pCVar16 = local_88;
          if (((pCVar15->super_CTcSymPropBase).field_0x2a & 2) == 0) {
            for (; pCVar16 != (CTcObjTemplateItem *)0x0; pCVar16 = pCVar16->nxt_) {
              pCVar20 = pCVar16;
              if (pCVar16->prop_ == pCVar15) {
                do {
                  if ((pCVar20->field_0x18 & 1) == 0) {
                    CTcTokenizer::log_error
                              (0x2b9c,(ulong)(uint)(pCVar15->super_CTcSymPropBase).super_CTcSymbol.
                                                   super_CTcSymbolBase.super_CVmHashEntryCS.
                                                   super_CVmHashEntry.len_,
                               (pCVar15->super_CTcSymPropBase).super_CTcSymbol.super_CTcSymbolBase.
                               super_CVmHashEntryCS.super_CVmHashEntry.str_);
                    goto LAB_001dca86;
                  }
                  ppCVar1 = &pCVar20->nxt_;
                  pCVar20 = *ppCVar1;
                } while (*ppCVar1 != (CTcObjTemplateItem *)0x0);
              }
            }
LAB_001dca86:
            pCVar16 = (CTcObjTemplateItem *)CTcPrsMem::alloc(G_prsmem,0x20);
            pCVar16->prop_ = pCVar15;
            pCVar16->tok_type_ = tVar12;
            pCVar16->field_0x18 = bVar27 * '\x02' | bVar19 | pCVar16->field_0x18 & 0xfc;
            goto LAB_001dcab7;
          }
          iVar9 = 0x2b9b;
          pcVar13 = (pCVar15->super_CTcSymPropBase).super_CTcSymbol.super_CTcSymbolBase.
                    super_CVmHashEntryCS.super_CVmHashEntry.str_;
          uVar2 = (uint)(pCVar15->super_CTcSymPropBase).super_CTcSymbol.super_CTcSymbolBase.
                        super_CVmHashEntryCS.super_CVmHashEntry.len_;
        }
        CTcTokenizer::log_error(iVar9,(ulong)uVar2,pcVar13);
      }
      else {
        pCVar16 = (CTcObjTemplateItem *)CTcPrsMem::alloc(G_prsmem,0x20);
        pCVar16->prop_ = (CTcSymProp *)0x0;
        pCVar16->tok_type_ = TOKT_INHERITED;
        pCVar16->field_0x18 = pCVar16->field_0x18 & 0xfc;
LAB_001dcab7:
        pCVar16->nxt_ = (CTcObjTemplateItem *)0x0;
        pCVar20 = pCVar16;
        if (bVar5) {
          pCVar21 = (CTcObjTemplateItem *)0x0;
          pCVar24 = (CTcObjTemplateItem *)0x0;
          if (pCVar17 != (CTcObjTemplateItem *)0x0) {
LAB_001dcaf1:
            pCVar17->nxt_ = pCVar16;
            pCVar21 = pCVar24;
            pCVar20 = local_88;
          }
        }
        else {
          pCVar21 = pCVar16;
          if (pCVar17 != (CTcObjTemplateItem *)0x0) {
            if ((pCVar17->field_0x18 & 1) == 0) {
              pCVar24 = pCVar16;
            }
            goto LAB_001dcaf1;
          }
        }
        local_70 = local_70 + 1;
        pCVar17 = pCVar16;
        pCVar24 = pCVar21;
        local_88 = pCVar20;
      }
    }
    if (!bVar23) {
      if (local_70 == 0) {
        CTcTokenizer::log_error(0x2bc5);
      }
      else if (bVar6) {
        if (bVar7) {
          add_inherited_templates(this,(CTcSymObj *)this_00,local_88,local_70);
        }
        else {
          add_template_def(this,(CTcSymObj *)this_00,local_88,local_70);
        }
      }
      return (CTPNStmTop *)0x0;
    }
  } while( true );
}

Assistant:

CTPNStmTop *CTcParser::parse_template_def(int *err, const CTcToken *class_tok)
{
    CTcToken prop_tok;
    CTcObjTemplateItem *alt_group_head;
    CTcObjTemplateItem *item_head;
    CTcObjTemplateItem *item_tail;
    CTcSymObj *class_sym;

    /* no items in our list yet */
    item_head = item_tail = alt_group_head = 0;
    size_t item_cnt = 0;

    /* presume we won't find an 'inherited' token */
    int found_inh = FALSE;

    /* 
     *   If there's a class token, it must refer to an object class.  If
     *   there's no such symbol defined yet, define it as an external
     *   object; otherwise, make sure the existing symbol is an object of
     *   metaclass tads-object.  
     */
    if (class_tok != 0)
    {
        /* 
         *   if the class token is 'string', it's a string template rather
         *   than an object template - go parse that separately if so 
         */
        if (class_tok->text_matches("string"))
            return parse_string_template_def(err);

        /* 
         *   Look up the symbol.  Don't mark the symbol as referenced; merely
         *   defining a template for an object doesn't require an external
         *   reference on the object.  
         */
        class_sym = (CTcSymObj *)get_global_symtab()->find_noref(
            class_tok->get_text(), class_tok->get_text_len(), 0);

        /* 
         *   if we didn't find it, define it; otherwise, ensure it's defined
         *   as an object 
         */
        if (class_sym == 0)
        {
            /* 
             *   it's undefined, so add a forward definition by creating the
             *   symbol as an external object 
             */
            class_sym = new CTcSymObj(class_tok->get_text(),
                                      class_tok->get_text_len(), FALSE,
                                      G_cg->new_obj_id(), TRUE,
                                      TC_META_TADSOBJ, 0);

            /* add it to the master symbol table */
            get_global_symtab()->add_entry(class_sym);
        }
        else if (class_sym->get_type() != TC_SYM_OBJ
                 || class_sym->get_metaclass() != TC_META_TADSOBJ)
        {
            /* it's defined incorrectly - flag the error */
            G_tok->log_error_curtok(TCERR_REDEF_AS_OBJ);

            /* forget the conflicting symbol and proceed with parsing */
            class_sym = 0;
        }
    }
    else
    {
        /* this is a root object template - there's no class symbol */
        class_sym = 0;
    }

    /* move on to the next token */
    G_tok->next();

    /* keep going until we run out of template tokens */
    int all_ok = TRUE;
    for (int done = FALSE ; !done ; )
    {
        tc_toktyp_t def_tok;
        int ok;
        int is_inh;
        int is_alt, is_opt;

        /* presume we will find a valid token */
        ok = TRUE;

        /* presume the defining token type is the current token */
        def_tok = G_tok->cur();

        /* presume this won't be an 'inherited' token */
        is_inh = FALSE;

        /* see what we have next */
        switch(G_tok->cur())
        {
        case TOKT_SEM:
            /* 
             *   that's the end of the statement - skip the semicolon, and
             *   we're done 
             */
            G_tok->next();
            done = TRUE;
            break;

        case TOKT_INHERITED:
            /* flag that we are to inherit superclass templates */
            is_inh = TRUE;
            found_inh = TRUE;
            break;

        case TOKT_SSTR:
        case TOKT_DSTR:
            /* string property */
            {
                utf8_ptr p;
                size_t rem;
                int valid;
                tc_toktyp_t kwtok;

                /* this is our property name token */
                prop_tok = *G_tok->copycur();

                /* 
                 *   this is also our defining token - the actual value in
                 *   object instances will use this string type 
                 */
                def_tok = G_tok->cur();
                
                /* 
                 *   make sure that the contents of the string forms a
                 *   valid symbol token 
                 */

                /* set up at the start of the token */
                p.set((char *)G_tok->getcur()->get_text());
                rem = G_tok->getcur()->get_text_len();

                /* make sure the first character is valid */
                valid = (rem != 0 && is_syminit(p.getch()));
                
                /* skip the first character */
                if (rem != 0)
                    p.inc(&rem);

                /* scan the rest of the string */
                for ( ; rem != 0 && valid ; p.inc(&rem))
                {
                    /* 
                     *   if this isn't a valid symbol character, we don't
                     *   have a valid symbol 
                     */
                    if (!is_sym(p.getch()))
                        valid = FALSE;
                }

                /* 
                 *   if the string is lexically valid as a symbol, make
                 *   sure it's not a keyword - if it is, it can't be a
                 *   property name 
                 */
                if (valid && G_tok->look_up_keyword(G_tok->getcur(), &kwtok))
                    valid = FALSE;

                /* if the symbol isn't valid, it's an error */
                if (!valid)
                {
                    /* log the error */
                    G_tok->log_error_curtok(TCERR_OBJ_TPL_STR_REQ_PROP);

                    /* note the problem */
                    ok = FALSE;
                }
            }
            break;

        case TOKT_LBRACK:
            /* list property - defining instances will use lists here */
            def_tok = G_tok->cur();

            /* the next token must be the property name */
            if (G_tok->next() != TOKT_SYM)
            {
                /* log an error */
                G_tok->log_error(TCERR_OBJ_TPL_OP_REQ_PROP,
                                 G_tok->get_op_text(def_tok),
                                 (int)G_tok->getcur()->get_text_len(),
                                 G_tok->getcur()->get_text());

                /* note that we don't have a valid token */
                ok = FALSE;

                /* 
                 *   if this token isn't ']' or something that looks like
                 *   an end-of-statement token, skip it 
                 */
                switch(G_tok->cur())
                {
                case TOKT_SEM:
                case TOKT_EOF:
                case TOKT_LBRACE:
                case TOKT_RBRACE:
                    /* 
                     *   don't skip any of these - they might be statement
                     *   enders 
                     */
                    break;

                case TOKT_RBRACK:
                    /* 
                     *   they must simply have left out the property - don't
                     *   skip this, since we'll skip a token shortly anyway 
                     */
                    break;

                default:
                    /* skip the errant token */
                    G_tok->next();
                    break;
                }
            }
            else
            {
                /* remember the property token */
                prop_tok = *G_tok->copycur();

                /* require the ']' token */
                if (G_tok->next() != TOKT_RBRACK)
                {
                    /* log the error */
                    G_tok->log_error_curtok(TCERR_OBJ_TPL_REQ_RBRACK);

                    /* 
                     *   proceed on the assumption that they simply left
                     *   out the ']' 
                     */
                }
            }
            break;

        case TOKT_AT:
        case TOKT_PLUS:
        case TOKT_MINUS:
        case TOKT_TIMES:
        case TOKT_DIV:
        case TOKT_MOD:
        case TOKT_ARROW:
        case TOKT_AND:
        case TOKT_NOT:
        case TOKT_BNOT:
        case TOKT_COMMA:
            /* the operator is the defining token */
            def_tok = G_tok->cur();

            /* the next token must be the property name */
            if (G_tok->next() != TOKT_SYM)
            {
                /* log an error */
                G_tok->log_error(TCERR_OBJ_TPL_OP_REQ_PROP,
                                 G_tok->get_op_text(def_tok),
                                 (int)G_tok->getcur()->get_text_len(),
                                 G_tok->getcur()->get_text());
                
                /* note that we don't have a valid token */
                ok = FALSE;
            }

            /* remember the property token */
            prop_tok = *G_tok->copycur();
            break;

        case TOKT_LBRACE:
        case TOKT_RBRACE:
        case TOKT_EOF:
        case TOKT_OBJECT:
            /* they must have left off the ';' */
            G_tok->log_error_curtok(TCERR_OBJ_TPL_BAD_TOK);

            /* 
             *   stop parsing here, assuming the statement should have
             *   ended by now 
             */
            done = TRUE;
            ok = FALSE;
            break;

        default:
            /* log an error and skip the invalid token */
            G_tok->log_error_curtok(TCERR_OBJ_TPL_BAD_TOK);
            G_tok->next();
            ok = FALSE;
            break;
        }

        /* presume we won't find an alternative or optionality suffix */
        is_opt = FALSE;
        is_alt = FALSE;

        /* 
         *   if we haven't reached the end of the statement, check to see if
         *   the item is optional or an alternative 
         */
        if (!done)
        {
            /* get the next token */
            G_tok->next();
            
            /* check to see if the item is optional */
            if (G_tok->cur() == TOKT_QUESTION)
            {
                /* it's optional */
                is_opt = TRUE;

                /* skip the '?' */
                G_tok->next();
            }

            /* check for an alternative */
            if (G_tok->cur() == TOKT_OR)
            {
                /* this item is an alternative */
                is_alt = TRUE;

                /* skip the '|' */
                G_tok->next();
            }
        }

        /* 
         *   If the previous item was followed by '|', we're in the same
         *   alternative group with that item.  This means we're optional if
         *   it's marked as optional, and all of the preceding items in our
         *   group are optional if we're marked as optional.  
         */
        if (item_tail != 0 && item_tail->is_alt_)
        {
            /* 
             *   if we're optional, mark all prior items in the group as
             *   optional 
             */
            if (is_opt)
            {
                CTcObjTemplateItem *item;

                /* mark everything in our group as optional */
                for (item = alt_group_head ; item != 0 ; item = item->nxt_)
                    item->is_opt_ = TRUE;
            }
            
            /* if the prior item was optional, we're optional */
            if (item_tail->is_opt_)
                is_opt = TRUE;
        }

        /* 
         *   if we encountered any problems, note that we have an error in
         *   the overall statement 
         */
        if (!ok)
            all_ok = FALSE;

        /* if we found a valid property token, add it to the template */
        if (!done && ok)
        {
            CTcSymProp *prop_sym;
            CTcObjTemplateItem *item;

            /* presume we won't create a new item */
            item = 0;

            /* check to see if it's a property or an 'inherited' token */
            if (is_inh)
            {
                /* create an 'inherited' template item */
                item = new (G_prsmem)
                       CTcObjTemplateItem(0, TOKT_INHERITED, FALSE, FALSE);
            }
            else
            {
                /* make sure we have a valid property name */
                prop_sym = look_up_prop(&prop_tok, FALSE);
                if (prop_sym == 0)
                {
                    /* couldn't find the property - log an error */
                    G_tok->log_error(TCERR_OBJ_TPL_SYM_NOT_PROP,
                                     (int)prop_tok.get_text_len(),
                                     prop_tok.get_text());
                }
                else if (prop_sym->is_vocab())
                {
                    /* dictionary properties are not valid in templates */
                    G_tok->log_error(TCERR_OBJ_TPL_NO_VOCAB,
                                     (int)prop_sym->get_sym_len(),
                                     prop_sym->get_sym());
                }
                else
                {
                    /* 
                     *   Scan the list so far to ensure that this same
                     *   property isn't already part of the list.  However,
                     *   do allow duplicates within the run of alternatives
                     *   of which the new item will be a part, since we'll
                     *   only end up using one of the alternatives and hence
                     *   the property will only be entered once in the
                     *   property even if it appears multiple times in the
                     *   run.  The run of alternatives of which we're a part
                     *   is the final run in the list, since we're being
                     *   added at the end of the list.  
                     */
                    for (item = item_head ; item != 0 ; item = item->nxt_)
                    {
                        /* check for a duplicate of this item's property */
                        if (item->prop_ == prop_sym)
                        {
                            CTcObjTemplateItem *sub;
                            
                            /* 
                             *   if everything from here to the end of the
                             *   list is marked as an alternative, then we're
                             *   just adding a duplicate property to a run of
                             *   alternatives, which is fine 
                             */
                            for (sub = item ; sub != 0 && sub->is_alt_ ;
                                 sub = sub->nxt_) ;

                            /* 
                             *   if we found a non-alternative following this
                             *   item, then this is indeed a duplicate; if we
                             *   didn't find any non-alternatives, we're just
                             *   adding this to a run of alternatives, so
                             *   we're okay 
                             */
                            if (sub != 0)
                            {
                                /* it's a duplicate - log the error */
                                G_tok->log_error(TCERR_OBJ_TPL_PROP_DUP,
                                    (int)prop_sym->get_sym_len(),
                                    prop_sym->get_sym());
                            
                                /* no need to look any further */
                                break;
                            }
                        }
                    }
                    
                    /* create the template item */
                    item = new (G_prsmem)
                           CTcObjTemplateItem(prop_sym, def_tok,
                                              is_alt, is_opt);
                }
            }
            
            /* if we have a valid new item, add it to our list */
            if (item != 0)
            {
                /* 
                 *   if we're an alternative and the prior item was not,
                 *   we're the head of a new alternative group; if we're not
                 *   an alternative, then we're not in an alternative group
                 *   after this item 
                 */
                if (is_alt && (item_tail == 0 || !item_tail->is_alt_))
                {
                    /* we're the head of a new group */
                    alt_group_head = item;
                }
                else if (!is_alt)
                {
                    /* we're no longer in an alternative group */
                    alt_group_head = 0;
                }

                /* link it into our list */
                if (item_tail != 0)
                    item_tail->nxt_ = item;
                else
                    item_head = item;
                item_tail = item;
            
                /* count it */
                ++item_cnt;
            }
        }
    }

    /* if the template is empty, warn about it */
    if (item_cnt == 0)
    {
        /* flag it as an error */
        G_tok->log_error(TCERR_TEMPLATE_EMPTY);

        /* there's no point in saving an empty template */
        all_ok = FALSE;
    }

    /* if we were successful, add the new template to our master list */
    if (all_ok)
    {
        /*
         *   If we found an 'inherited' keyword, we must expand the template
         *   with all inherited templates.  Otherwise, simply add the
         *   template exactly as given. 
         */
        if (found_inh)
        {
            /*
             *   Traverse all superclass templates and add each inherited
             *   form. 
             */
            add_inherited_templates(class_sym, item_head, item_cnt);
        }
        else
        {
            /* add our single template */
            add_template_def(class_sym, item_head, item_cnt);
        }
    }

    /* an 'object template' statement generates no tree data */
    return 0;
}